

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O1

int run_test_fs_file_async(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  int extraout_EAX_04;
  int extraout_EAX_05;
  uv_loop_t *puVar2;
  uv_fs_t *loop;
  char *pcVar3;
  uv_file add_flags;
  int iVar4;
  uv_fs_t *puVar5;
  char *unaff_R12;
  uv_fs_t *unaff_R14;
  uv_dirent_t *unaff_R15;
  uv_buf_t uVar6;
  uv_dirent_t dent;
  uv_dirent_t dent_00;
  uv_dirent_t uStackY_d8;
  uv_loop_t *puStackY_c8;
  char *pcStackY_c0;
  uv_fs_t *puStackY_b0;
  code *pcStackY_a8;
  code *pcStackY_a0;
  uv_dirent_t uStackY_98;
  char *pcStackY_88;
  
  unlink("test_file");
  unlink("test_file2");
  puVar2 = uv_default_loop();
  ::loop = puVar2;
  iVar1 = uv_fs_open(puVar2,&open_req1,"test_file",0x41,0x180,create_cb);
  if (iVar1 == 0) {
    puVar2 = ::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (create_cb_count != 1) goto LAB_0015061b;
    if (write_cb_count != 1) goto LAB_00150620;
    if (fsync_cb_count != 1) goto LAB_00150625;
    if (fdatasync_cb_count != 1) goto LAB_0015062a;
    if (close_cb_count != 1) goto LAB_0015062f;
    puVar2 = ::loop;
    iVar1 = uv_fs_rename(::loop,&rename_req,"test_file","test_file2",rename_cb);
    if (iVar1 != 0) goto LAB_00150634;
    puVar2 = ::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (create_cb_count != 1) goto LAB_00150639;
    if (write_cb_count != 1) goto LAB_0015063e;
    if (close_cb_count != 1) goto LAB_00150643;
    if (rename_cb_count != 1) goto LAB_00150648;
    puVar2 = ::loop;
    iVar1 = uv_fs_open(::loop,&open_req1,"test_file2",2,0,open_cb);
    if (iVar1 != 0) goto LAB_0015064d;
    puVar2 = ::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (open_cb_count != 1) goto LAB_00150652;
    if (read_cb_count != 1) goto LAB_00150657;
    if (close_cb_count != 2) goto LAB_0015065c;
    if (rename_cb_count != 1) goto LAB_00150661;
    if (create_cb_count != 1) goto LAB_00150666;
    if (write_cb_count != 1) goto LAB_0015066b;
    if (ftruncate_cb_count != 1) goto LAB_00150670;
    puVar2 = ::loop;
    iVar1 = uv_fs_open(::loop,&open_req1,"test_file2",0,0,open_cb);
    if (iVar1 != 0) goto LAB_00150675;
    puVar2 = ::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (open_cb_count != 2) goto LAB_0015067a;
    if (read_cb_count != 2) goto LAB_0015067f;
    if (close_cb_count != 3) goto LAB_00150684;
    if (rename_cb_count != 1) goto LAB_00150689;
    if (unlink_cb_count != 1) goto LAB_0015068e;
    if (create_cb_count != 1) goto LAB_00150693;
    if (write_cb_count != 1) goto LAB_00150698;
    if (ftruncate_cb_count != 1) goto LAB_0015069d;
    unlink("test_file");
    unlink("test_file2");
    puVar2 = uv_default_loop();
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    uv_run(puVar2,UV_RUN_DEFAULT);
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_fs_file_async_cold_1();
LAB_0015061b:
    run_test_fs_file_async_cold_2();
LAB_00150620:
    run_test_fs_file_async_cold_3();
LAB_00150625:
    run_test_fs_file_async_cold_4();
LAB_0015062a:
    run_test_fs_file_async_cold_5();
LAB_0015062f:
    run_test_fs_file_async_cold_6();
LAB_00150634:
    run_test_fs_file_async_cold_7();
LAB_00150639:
    run_test_fs_file_async_cold_8();
LAB_0015063e:
    run_test_fs_file_async_cold_9();
LAB_00150643:
    run_test_fs_file_async_cold_10();
LAB_00150648:
    run_test_fs_file_async_cold_11();
LAB_0015064d:
    run_test_fs_file_async_cold_12();
LAB_00150652:
    run_test_fs_file_async_cold_13();
LAB_00150657:
    run_test_fs_file_async_cold_14();
LAB_0015065c:
    run_test_fs_file_async_cold_15();
LAB_00150661:
    run_test_fs_file_async_cold_16();
LAB_00150666:
    run_test_fs_file_async_cold_17();
LAB_0015066b:
    run_test_fs_file_async_cold_18();
LAB_00150670:
    run_test_fs_file_async_cold_19();
LAB_00150675:
    run_test_fs_file_async_cold_20();
LAB_0015067a:
    run_test_fs_file_async_cold_21();
LAB_0015067f:
    run_test_fs_file_async_cold_22();
LAB_00150684:
    run_test_fs_file_async_cold_23();
LAB_00150689:
    run_test_fs_file_async_cold_24();
LAB_0015068e:
    run_test_fs_file_async_cold_25();
LAB_00150693:
    run_test_fs_file_async_cold_26();
LAB_00150698:
    run_test_fs_file_async_cold_27();
LAB_0015069d:
    run_test_fs_file_async_cold_28();
  }
  run_test_fs_file_async_cold_29();
  if (puVar2 == (uv_loop_t *)&open_req1) {
    if (open_req1.fs_type != UV_FS_OPEN) goto LAB_0015073f;
    if (open_req1.result._4_4_ < 0) goto LAB_00150744;
    create_cb_count = create_cb_count + 1;
    uv_fs_req_cleanup(&open_req1);
    iov = uv_buf_init(test_buf,0xd);
    iVar4 = 0x1578d4;
    puVar2 = ::loop;
    iVar1 = uv_fs_write(::loop,&write_req,(uv_file)open_req1.result,&iov,1,-1,write_cb);
    if (iVar1 == 0) {
      return iVar4;
    }
  }
  else {
    create_cb_cold_1();
LAB_0015073f:
    create_cb_cold_2();
LAB_00150744:
    create_cb_cold_3();
  }
  create_cb_cold_4();
  if (puVar2 == (uv_loop_t *)&rename_req) {
    if (rename_req.fs_type != UV_FS_RENAME) goto LAB_00150786;
    if (rename_req.result == 0) {
      rename_cb_count = rename_cb_count + 1;
      uv_fs_req_cleanup(&rename_req);
      return extraout_EAX;
    }
  }
  else {
    rename_cb_cold_1();
LAB_00150786:
    rename_cb_cold_2();
  }
  rename_cb_cold_3();
  if (puVar2 == (uv_loop_t *)&open_req1) {
    if (open_req1.fs_type != UV_FS_OPEN) goto LAB_00150877;
    add_flags = (uv_file)open_req1.result;
    if (open_req1.result._4_4_ < 0) goto LAB_0015087c;
    open_cb_count = open_cb_count + 1;
    if (open_req1.path == (char *)0x0) goto LAB_00150881;
    if (*(long *)(open_req1.path + 3) != 0x32656c69665f74 ||
        *(long *)open_req1.path != 0x6c69665f74736574) goto LAB_00150886;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    uVar6 = uv_buf_init(buf,0x20);
    iVar4 = 0x157a8e;
    puVar2 = ::loop;
    iov = uVar6;
    iVar1 = uv_fs_read(::loop,&read_req,(uv_file)open_req1.result,&iov,1,-1,read_cb);
    add_flags = (uv_file)puVar2;
    if (iVar1 == 0) {
      return iVar4;
    }
  }
  else {
    open_cb_cold_1();
LAB_00150877:
    add_flags = (uv_file)puVar2;
    open_cb_cold_2();
LAB_0015087c:
    open_cb_cold_6();
LAB_00150881:
    open_cb_cold_5();
LAB_00150886:
    open_cb_cold_3();
  }
  open_cb_cold_4();
  fs_file_sync(add_flags);
  fs_file_sync(add_flags);
  puVar2 = uv_default_loop();
  uv_walk(puVar2,close_walk_cb,(void *)0x0);
  uv_run(puVar2,UV_RUN_DEFAULT);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 == 0) {
    return 0;
  }
  run_test_fs_file_sync_cold_1();
  unlink("test_file");
  unlink("test_file2");
  puVar2 = uv_default_loop();
  ::loop = puVar2;
  iVar1 = uv_fs_open(puVar2,&open_req1,"test_file",0x41,0x180,(uv_fs_cb)0x0);
  iVar4 = (int)puVar2;
  if (iVar1 < 0) {
    fs_file_sync_cold_1();
LAB_00150cdf:
    fs_file_sync_cold_2();
LAB_00150ce4:
    fs_file_sync_cold_3();
LAB_00150ce9:
    fs_file_sync_cold_4();
LAB_00150cee:
    fs_file_sync_cold_5();
LAB_00150cf3:
    fs_file_sync_cold_6();
LAB_00150cf8:
    fs_file_sync_cold_7();
LAB_00150cfd:
    fs_file_sync_cold_8();
LAB_00150d02:
    fs_file_sync_cold_9();
LAB_00150d07:
    fs_file_sync_cold_10();
LAB_00150d0c:
    fs_file_sync_cold_11();
LAB_00150d11:
    fs_file_sync_cold_12();
LAB_00150d16:
    fs_file_sync_cold_13();
LAB_00150d1b:
    fs_file_sync_cold_14();
LAB_00150d20:
    fs_file_sync_cold_15();
LAB_00150d25:
    fs_file_sync_cold_16();
LAB_00150d2a:
    fs_file_sync_cold_17();
LAB_00150d2f:
    fs_file_sync_cold_18();
LAB_00150d34:
    fs_file_sync_cold_19();
LAB_00150d39:
    fs_file_sync_cold_20();
LAB_00150d3e:
    fs_file_sync_cold_21();
LAB_00150d43:
    fs_file_sync_cold_22();
LAB_00150d48:
    fs_file_sync_cold_23();
LAB_00150d4d:
    fs_file_sync_cold_24();
LAB_00150d52:
    fs_file_sync_cold_25();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_00150cdf;
    uv_fs_req_cleanup(&open_req1);
    uVar6 = uv_buf_init(test_buf,0xd);
    iVar4 = 0;
    iov = uVar6;
    iVar1 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,&iov,1,-1,
                        (uv_fs_cb)0x0);
    if (iVar1 < 0) goto LAB_00150ce4;
    if (write_req.result < 0) goto LAB_00150ce9;
    uv_fs_req_cleanup(&write_req);
    iVar4 = 0;
    iVar1 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_00150cee;
    if (close_req.result != 0) goto LAB_00150cf3;
    uv_fs_req_cleanup(&close_req);
    iVar4 = 0;
    iVar1 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",2,0,(uv_fs_cb)0x0);
    if (iVar1 < 0) goto LAB_00150cf8;
    if (open_req1.result._4_4_ < 0) goto LAB_00150cfd;
    uv_fs_req_cleanup(&open_req1);
    uVar6 = uv_buf_init(buf,0x20);
    iVar4 = 0;
    iov = uVar6;
    iVar1 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,-1,(uv_fs_cb)0x0)
    ;
    if (iVar1 < 0) goto LAB_00150d02;
    if (read_req.result < 0) goto LAB_00150d07;
    iVar4 = 0x2fbca0;
    iVar1 = strcmp(buf,test_buf);
    if (iVar1 != 0) goto LAB_00150d0c;
    uv_fs_req_cleanup(&read_req);
    iVar4 = 0;
    iVar1 = uv_fs_ftruncate((uv_loop_t *)0x0,&ftruncate_req,(uv_file)open_req1.result,7,
                            (uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_00150d11;
    if (ftruncate_req.result != 0) goto LAB_00150d16;
    uv_fs_req_cleanup(&ftruncate_req);
    iVar4 = 0;
    iVar1 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_00150d1b;
    if (close_req.result != 0) goto LAB_00150d20;
    uv_fs_req_cleanup(&close_req);
    iVar4 = 0;
    iVar1 = uv_fs_rename((uv_loop_t *)0x0,&rename_req,"test_file","test_file2",(uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_00150d25;
    if (rename_req.result != 0) goto LAB_00150d2a;
    uv_fs_req_cleanup(&rename_req);
    iVar4 = 0;
    iVar1 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file2",0,0,(uv_fs_cb)0x0);
    if (iVar1 < 0) goto LAB_00150d2f;
    if (open_req1.result._4_4_ < 0) goto LAB_00150d34;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    uVar6 = uv_buf_init(buf,0x20);
    iVar4 = 0;
    iov = uVar6;
    iVar1 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,-1,(uv_fs_cb)0x0)
    ;
    if (iVar1 < 0) goto LAB_00150d39;
    if (read_req.result < 0) goto LAB_00150d3e;
    if (buf._0_8_ != 0x75622d74736574) goto LAB_00150d43;
    uv_fs_req_cleanup(&read_req);
    iVar4 = 0;
    iVar1 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_00150d48;
    if (close_req.result != 0) goto LAB_00150d4d;
    uv_fs_req_cleanup(&close_req);
    iVar4 = 0;
    iVar1 = uv_fs_unlink((uv_loop_t *)0x0,&unlink_req,"test_file2",(uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_00150d52;
    if (unlink_req.result == 0) {
      uv_fs_req_cleanup(&unlink_req);
      unlink("test_file");
      iVar1 = unlink("test_file2");
      return iVar1;
    }
  }
  fs_file_sync_cold_26();
  fs_file_write_null_buffer(iVar4);
  fs_file_write_null_buffer(iVar4);
  puVar2 = uv_default_loop();
  uv_walk(puVar2,close_walk_cb,(void *)0x0);
  uv_run(puVar2,UV_RUN_DEFAULT);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 == 0) {
    return 0;
  }
  run_test_fs_file_write_null_buffer_cold_1();
  unlink("test_file");
  ::loop = uv_default_loop();
  iVar1 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x41,0x180,(uv_fs_cb)0x0);
  if (iVar1 < 0) {
    fs_file_write_null_buffer_cold_1();
LAB_00150eac:
    fs_file_write_null_buffer_cold_2();
LAB_00150eb1:
    fs_file_write_null_buffer_cold_3();
LAB_00150eb6:
    fs_file_write_null_buffer_cold_4();
LAB_00150ebb:
    fs_file_write_null_buffer_cold_5();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_00150eac;
    uv_fs_req_cleanup(&open_req1);
    uVar6 = uv_buf_init((char *)0x0,0);
    iov = uVar6;
    iVar1 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,&iov,1,-1,
                        (uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_00150eb1;
    if (write_req.result != 0) goto LAB_00150eb6;
    uv_fs_req_cleanup(&write_req);
    iVar1 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_00150ebb;
    if (close_req.result == 0) {
      uv_fs_req_cleanup(&close_req);
      iVar1 = unlink("test_file");
      return iVar1;
    }
  }
  fs_file_write_null_buffer_cold_6();
  pcStackY_88 = "test_file";
  pcStackY_a0 = (code *)0x150ede;
  unlink("test_dir/file1");
  pcStackY_a0 = (code *)0x150eea;
  unlink("test_dir/file2");
  puVar2 = (uv_loop_t *)0x194437;
  pcStackY_a0 = (code *)0x150ef9;
  rmdir("test_dir");
  pcStackY_a0 = (code *)0x150efe;
  loop = (uv_fs_t *)uv_default_loop();
  pcStackY_a0 = (code *)0x150f23;
  ::loop = (uv_loop_t *)loop;
  iVar1 = uv_fs_mkdir((uv_loop_t *)loop,&mkdir_req,"test_dir",0x1ed,mkdir_cb);
  if (iVar1 == 0) {
    pcStackY_a0 = (code *)0x150f39;
    loop = (uv_fs_t *)::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (mkdir_cb_count != 1) goto LAB_00151341;
    loop = (uv_fs_t *)0x0;
    pcStackY_a0 = (code *)0x150f69;
    iVar1 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_dir/file1",0x41,0x180,(uv_fs_cb)0x0);
    if (iVar1 < 0) goto LAB_00151346;
    pcStackY_a0 = (code *)0x150f7d;
    uv_fs_req_cleanup(&open_req1);
    loop = (uv_fs_t *)0x0;
    pcStackY_a0 = (code *)0x150f93;
    iVar1 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_0015134b;
    pcStackY_a0 = (code *)0x150fa7;
    uv_fs_req_cleanup(&close_req);
    loop = (uv_fs_t *)0x0;
    pcStackY_a0 = (code *)0x150fca;
    iVar1 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_dir/file2",0x41,0x180,(uv_fs_cb)0x0);
    if (iVar1 < 0) goto LAB_00151350;
    pcStackY_a0 = (code *)0x150fde;
    uv_fs_req_cleanup(&open_req1);
    loop = (uv_fs_t *)0x0;
    pcStackY_a0 = (code *)0x150ff4;
    iVar1 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_00151355;
    pcStackY_a0 = (code *)0x151008;
    uv_fs_req_cleanup(&close_req);
    pcStackY_a0 = (code *)0x15102b;
    loop = (uv_fs_t *)::loop;
    iVar1 = uv_fs_scandir(::loop,&scandir_req,"test_dir",0,scandir_cb);
    if (iVar1 != 0) goto LAB_0015135a;
    pcStackY_a0 = (code *)0x151041;
    loop = (uv_fs_t *)::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (scandir_cb_count != 1) goto LAB_0015135f;
    loop = (uv_fs_t *)0x0;
    pcStackY_a0 = (code *)0x151068;
    iVar1 = uv_fs_scandir((uv_loop_t *)0x0,&scandir_req,"test_dir",0,(uv_fs_cb)0x0);
    if (iVar1 != 2) goto LAB_00151364;
    if (scandir_req.result != 2) goto LAB_00151369;
    if (scandir_req.ptr == (void *)0x0) goto LAB_0015136e;
    pcStackY_a0 = (code *)0x15109c;
    iVar1 = uv_fs_scandir_next(&scandir_req,&uStackY_98);
    if (iVar1 != -0xfff) {
      puVar2 = (uv_loop_t *)0x192f38;
      unaff_R14 = &scandir_req;
      unaff_R12 = "file2";
      do {
        loop = (uv_fs_t *)uStackY_98.name;
        pcVar3 = "file1";
        pcStackY_a0 = (code *)0x1510ca;
        iVar1 = strcmp(uStackY_98.name,"file1");
        if (iVar1 != 0) {
          pcVar3 = "file2";
          pcStackY_a0 = (code *)0x1510d9;
          iVar1 = strcmp((char *)loop,"file2");
          if (iVar1 != 0) {
            pcStackY_a0 = (code *)0x15133c;
            run_test_fs_async_dir_cold_11();
            unaff_R15 = &uStackY_98;
            goto LAB_0015133c;
          }
        }
        dent.name = (char *)(ulong)uStackY_98.type;
        pcStackY_a0 = (code *)0x1510ea;
        dent._8_8_ = pcVar3;
        assert_is_file_type(dent);
        pcStackY_a0 = (code *)0x1510f5;
        iVar1 = uv_fs_scandir_next(&scandir_req,&uStackY_98);
        unaff_R15 = &uStackY_98;
      } while (iVar1 != -0xfff);
    }
    loop = &scandir_req;
    pcStackY_a0 = (code *)0x151108;
    uv_fs_req_cleanup(&scandir_req);
    if (scandir_req.ptr != (void *)0x0) goto LAB_00151373;
    pcStackY_a0 = (code *)0x151137;
    loop = (uv_fs_t *)::loop;
    iVar1 = uv_fs_stat(::loop,&stat_req,"test_dir",stat_cb);
    if (iVar1 != 0) goto LAB_00151378;
    pcStackY_a0 = (code *)0x15114d;
    uv_run(::loop,UV_RUN_DEFAULT);
    pcStackY_a0 = (code *)0x15116e;
    loop = (uv_fs_t *)::loop;
    iVar1 = uv_fs_stat(::loop,&stat_req,"test_dir/",stat_cb);
    if (iVar1 != 0) goto LAB_0015137d;
    pcStackY_a0 = (code *)0x151184;
    uv_run(::loop,UV_RUN_DEFAULT);
    pcStackY_a0 = (code *)0x1511a5;
    loop = (uv_fs_t *)::loop;
    iVar1 = uv_fs_lstat(::loop,&stat_req,"test_dir",stat_cb);
    if (iVar1 != 0) goto LAB_00151382;
    pcStackY_a0 = (code *)0x1511bb;
    uv_run(::loop,UV_RUN_DEFAULT);
    pcStackY_a0 = (code *)0x1511dc;
    loop = (uv_fs_t *)::loop;
    iVar1 = uv_fs_lstat(::loop,&stat_req,"test_dir/",stat_cb);
    if (iVar1 != 0) goto LAB_00151387;
    pcStackY_a0 = (code *)0x1511f2;
    loop = (uv_fs_t *)::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (stat_cb_count != 4) goto LAB_0015138c;
    pcStackY_a0 = (code *)0x151220;
    loop = (uv_fs_t *)::loop;
    iVar1 = uv_fs_unlink(::loop,&unlink_req,"test_dir/file1",unlink_cb);
    if (iVar1 != 0) goto LAB_00151391;
    pcStackY_a0 = (code *)0x151236;
    loop = (uv_fs_t *)::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (unlink_cb_count != 1) goto LAB_00151396;
    pcStackY_a0 = (code *)0x151264;
    loop = (uv_fs_t *)::loop;
    iVar1 = uv_fs_unlink(::loop,&unlink_req,"test_dir/file2",unlink_cb);
    if (iVar1 != 0) goto LAB_0015139b;
    pcStackY_a0 = (code *)0x15127a;
    loop = (uv_fs_t *)::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (unlink_cb_count != 2) goto LAB_001513a0;
    pcStackY_a0 = (code *)0x1512a8;
    loop = (uv_fs_t *)::loop;
    iVar1 = uv_fs_rmdir(::loop,&rmdir_req,"test_dir",rmdir_cb);
    if (iVar1 != 0) goto LAB_001513a5;
    pcStackY_a0 = (code *)0x1512be;
    loop = (uv_fs_t *)::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (rmdir_cb_count != 1) goto LAB_001513aa;
    pcStackY_a0 = (code *)0x1512d7;
    unlink("test_dir/file1");
    pcStackY_a0 = (code *)0x1512e3;
    unlink("test_dir/file2");
    pcStackY_a0 = (code *)0x1512ef;
    rmdir("test_dir");
    pcStackY_a0 = (code *)0x1512f4;
    puVar2 = uv_default_loop();
    pcStackY_a0 = (code *)0x151308;
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    pcStackY_a0 = (code *)0x151312;
    uv_run(puVar2,UV_RUN_DEFAULT);
    pcStackY_a0 = (code *)0x151317;
    loop = (uv_fs_t *)uv_default_loop();
    pcStackY_a0 = (code *)0x15131f;
    iVar1 = uv_loop_close((uv_loop_t *)loop);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
LAB_0015133c:
    pcStackY_a0 = (code *)0x151341;
    run_test_fs_async_dir_cold_1();
LAB_00151341:
    pcStackY_a0 = (code *)0x151346;
    run_test_fs_async_dir_cold_2();
LAB_00151346:
    pcStackY_a0 = (code *)0x15134b;
    run_test_fs_async_dir_cold_3();
LAB_0015134b:
    pcStackY_a0 = (code *)0x151350;
    run_test_fs_async_dir_cold_4();
LAB_00151350:
    pcStackY_a0 = (code *)0x151355;
    run_test_fs_async_dir_cold_5();
LAB_00151355:
    pcStackY_a0 = (code *)0x15135a;
    run_test_fs_async_dir_cold_6();
LAB_0015135a:
    pcStackY_a0 = (code *)0x15135f;
    run_test_fs_async_dir_cold_7();
LAB_0015135f:
    pcStackY_a0 = (code *)0x151364;
    run_test_fs_async_dir_cold_8();
LAB_00151364:
    pcStackY_a0 = (code *)0x151369;
    run_test_fs_async_dir_cold_9();
LAB_00151369:
    pcStackY_a0 = (code *)0x15136e;
    run_test_fs_async_dir_cold_10();
LAB_0015136e:
    pcStackY_a0 = (code *)0x151373;
    run_test_fs_async_dir_cold_25();
LAB_00151373:
    pcStackY_a0 = (code *)0x151378;
    run_test_fs_async_dir_cold_12();
LAB_00151378:
    pcStackY_a0 = (code *)0x15137d;
    run_test_fs_async_dir_cold_13();
LAB_0015137d:
    pcStackY_a0 = (code *)0x151382;
    run_test_fs_async_dir_cold_14();
LAB_00151382:
    pcStackY_a0 = (code *)0x151387;
    run_test_fs_async_dir_cold_15();
LAB_00151387:
    pcStackY_a0 = (code *)0x15138c;
    run_test_fs_async_dir_cold_16();
LAB_0015138c:
    pcStackY_a0 = (code *)0x151391;
    run_test_fs_async_dir_cold_17();
LAB_00151391:
    pcStackY_a0 = (code *)0x151396;
    run_test_fs_async_dir_cold_18();
LAB_00151396:
    pcStackY_a0 = (code *)0x15139b;
    run_test_fs_async_dir_cold_19();
LAB_0015139b:
    pcStackY_a0 = (code *)0x1513a0;
    run_test_fs_async_dir_cold_20();
LAB_001513a0:
    pcStackY_a0 = (code *)0x1513a5;
    run_test_fs_async_dir_cold_21();
LAB_001513a5:
    pcStackY_a0 = (code *)0x1513aa;
    run_test_fs_async_dir_cold_22();
LAB_001513aa:
    pcStackY_a0 = (code *)0x1513af;
    run_test_fs_async_dir_cold_23();
  }
  pcStackY_a0 = mkdir_cb;
  run_test_fs_async_dir_cold_24();
  if (loop == &mkdir_req) {
    if (mkdir_req.fs_type != UV_FS_MKDIR) goto LAB_0015140e;
    if (mkdir_req.result != 0) goto LAB_00151413;
    mkdir_cb_count = mkdir_cb_count + 1;
    if (mkdir_req.path == (char *)0x0) goto LAB_00151418;
    if (mkdir_req.path[8] == '\0' && *(long *)mkdir_req.path == 0x7269645f74736574) {
      uv_fs_req_cleanup(&mkdir_req);
      return extraout_EAX_00;
    }
  }
  else {
    pcStackY_a8 = (code *)0x15140e;
    mkdir_cb_cold_1();
LAB_0015140e:
    pcStackY_a8 = (code *)0x151413;
    mkdir_cb_cold_2();
LAB_00151413:
    pcStackY_a8 = (code *)0x151418;
    mkdir_cb_cold_3();
LAB_00151418:
    pcStackY_a8 = (code *)0x15141d;
    mkdir_cb_cold_5();
  }
  pcStackY_a8 = scandir_cb;
  mkdir_cb_cold_4();
  puStackY_c8 = puVar2;
  pcStackY_c0 = unaff_R12;
  puStackY_b0 = unaff_R14;
  pcStackY_a8 = (code *)unaff_R15;
  if (loop == &scandir_req) {
    puVar5 = loop;
    if (scandir_req.fs_type != UV_FS_SCANDIR) goto LAB_00151529;
    if (scandir_req.result != 2) goto LAB_0015152e;
    if (scandir_req.ptr == (void *)0x0) goto LAB_00151533;
    puVar5 = &scandir_req;
    iVar1 = uv_fs_scandir_next(&scandir_req,&uStackY_d8);
    loop = (uv_fs_t *)uStackY_d8.name;
    while (iVar1 != -0xfff) {
      pcVar3 = "file1";
      uStackY_d8.name = (char *)loop;
      iVar1 = strcmp((char *)loop,"file1");
      if (iVar1 != 0) {
        pcVar3 = "file2";
        iVar1 = strcmp((char *)loop,"file2");
        if (iVar1 != 0) {
          scandir_cb_cold_4();
          goto LAB_00151524;
        }
      }
      dent_00.name = (char *)(ulong)uStackY_d8.type;
      dent_00._8_8_ = pcVar3;
      assert_is_file_type(dent_00);
      puVar5 = &scandir_req;
      iVar1 = uv_fs_scandir_next(&scandir_req,&uStackY_d8);
      loop = (uv_fs_t *)uStackY_d8.name;
    }
    scandir_cb_count = scandir_cb_count + 1;
    if ((long *)scandir_req.path == (long *)0x0) goto LAB_00151538;
    if ((char)*(long *)((long)scandir_req.path + 8) != '\0' ||
        *(long *)scandir_req.path != 0x7269645f74736574) goto LAB_0015153d;
    puVar5 = &scandir_req;
    uv_fs_req_cleanup(&scandir_req);
    if (scandir_req.ptr == (void *)0x0) {
      return extraout_EAX_01;
    }
  }
  else {
LAB_00151524:
    scandir_cb_cold_1();
    puVar5 = loop;
LAB_00151529:
    scandir_cb_cold_2();
LAB_0015152e:
    scandir_cb_cold_3();
LAB_00151533:
    scandir_cb_cold_8();
LAB_00151538:
    scandir_cb_cold_7();
LAB_0015153d:
    scandir_cb_cold_5();
  }
  scandir_cb_cold_6();
  if ((uint)puVar5 < 2) {
    return extraout_EAX_02;
  }
  assert_is_file_type_cold_1();
  if (puVar5 == &stat_req) {
    if ((stat_req.fs_type & ~UV_FS_OPEN) != UV_FS_STAT) goto LAB_001515a5;
    if (stat_req.result != 0) goto LAB_001515aa;
    if (stat_req.ptr == (void *)0x0) goto LAB_001515af;
    stat_cb_count = stat_cb_count + 1;
    puVar5 = &stat_req;
    uv_fs_req_cleanup(&stat_req);
    if (stat_req.ptr == (void *)0x0) {
      return extraout_EAX_03;
    }
  }
  else {
    stat_cb_cold_1();
LAB_001515a5:
    stat_cb_cold_2();
LAB_001515aa:
    stat_cb_cold_3();
LAB_001515af:
    stat_cb_cold_5();
  }
  stat_cb_cold_4();
  if (puVar5 == &unlink_req) {
    if (unlink_req.fs_type != UV_FS_UNLINK) goto LAB_001515f1;
    if (unlink_req.result == 0) {
      unlink_cb_count = unlink_cb_count + 1;
      uv_fs_req_cleanup(&unlink_req);
      return extraout_EAX_04;
    }
  }
  else {
    unlink_cb_cold_1();
LAB_001515f1:
    unlink_cb_cold_2();
  }
  unlink_cb_cold_3();
  if (puVar5 == &rmdir_req) {
    if (rmdir_req.fs_type != UV_FS_RMDIR) goto LAB_00151655;
    if (rmdir_req.result != 0) goto LAB_0015165a;
    rmdir_cb_count = rmdir_cb_count + 1;
    if (rmdir_req.path != (char *)0x0) {
      if (rmdir_req.path[8] == '\0' && *(long *)rmdir_req.path == 0x7269645f74736574) {
        uv_fs_req_cleanup(&rmdir_req);
        return extraout_EAX_05;
      }
      goto LAB_00151664;
    }
  }
  else {
    rmdir_cb_cold_1();
LAB_00151655:
    rmdir_cb_cold_2();
LAB_0015165a:
    rmdir_cb_cold_3();
  }
  rmdir_cb_cold_5();
LAB_00151664:
  rmdir_cb_cold_4();
  test_sendfile(sendfile_setup,sendfile_cb,0x1000a);
  return 0;
}

Assistant:

TEST_IMPL(fs_file_async) {
  int r;

  /* Setup. */
  unlink("test_file");
  unlink("test_file2");

  loop = uv_default_loop();

  r = uv_fs_open(loop, &open_req1, "test_file", O_WRONLY | O_CREAT,
      S_IRUSR | S_IWUSR, create_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(create_cb_count == 1);
  ASSERT(write_cb_count == 1);
  ASSERT(fsync_cb_count == 1);
  ASSERT(fdatasync_cb_count == 1);
  ASSERT(close_cb_count == 1);

  r = uv_fs_rename(loop, &rename_req, "test_file", "test_file2", rename_cb);
  ASSERT(r == 0);

  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(create_cb_count == 1);
  ASSERT(write_cb_count == 1);
  ASSERT(close_cb_count == 1);
  ASSERT(rename_cb_count == 1);

  r = uv_fs_open(loop, &open_req1, "test_file2", O_RDWR, 0, open_cb);
  ASSERT(r == 0);

  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(open_cb_count == 1);
  ASSERT(read_cb_count == 1);
  ASSERT(close_cb_count == 2);
  ASSERT(rename_cb_count == 1);
  ASSERT(create_cb_count == 1);
  ASSERT(write_cb_count == 1);
  ASSERT(ftruncate_cb_count == 1);

  r = uv_fs_open(loop, &open_req1, "test_file2", O_RDONLY, 0, open_cb);
  ASSERT(r == 0);

  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(open_cb_count == 2);
  ASSERT(read_cb_count == 2);
  ASSERT(close_cb_count == 3);
  ASSERT(rename_cb_count == 1);
  ASSERT(unlink_cb_count == 1);
  ASSERT(create_cb_count == 1);
  ASSERT(write_cb_count == 1);
  ASSERT(ftruncate_cb_count == 1);

  /* Cleanup. */
  unlink("test_file");
  unlink("test_file2");

  MAKE_VALGRIND_HAPPY();
  return 0;
}